

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formats.h
# Opt level: O2

string * __thiscall
ktx::toString_abi_cxx11_(string *__return_storage_ptr__,ktx *this,khr_df_model_e model)

{
  char *__s;
  undefined4 in_register_00000014;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  ulong local_28 [3];
  
  __s = (char *)dfdToStringColorModel
                          ((ulong)this & 0xffffffff,this,CONCAT44(in_register_00000014,model));
  if (__s == (char *)0x0) {
    fmt.size_ = 2;
    fmt.data_ = (char *)0xa;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_28;
    local_28[0] = (ulong)this & 0xffffffff;
    ::fmt::v10::vformat_abi_cxx11_(__return_storage_ptr__,(v10 *)"(0x{:02X})",fmt,args);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] inline std::string toString(khr_df_model_e model) noexcept {
    const auto str = dfdToStringColorModel(model);
    return str ? std::string(str) : fmt::format("(0x{:02X})", static_cast<uint32_t>(model));
}